

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

bool __thiscall amrex::ParmParse::contains(ParmParse *this,char *name)

{
  bool bVar1;
  Table *pTVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  allocator local_81;
  _List_node_base *local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  p_Var4 = (_List_node_base *)this->m_table;
  local_80 = p_Var4;
  local_78 = name;
  do {
    p_Var4 = (((_List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == local_80) goto LAB_003ea65d;
    std::__cxx11::string::string((string *)&local_70,local_78,&local_81);
    prefixedName(&local_50,this,&local_70);
    bVar1 = anon_unknown_12::ppfound(&local_50,(PP_entry *)(p_Var4 + 1),false);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  } while (!bVar1);
  pTVar2 = this->m_table;
  p_Var3 = (_List_node_base *)pTVar2;
  while (p_Var3 = (((Table *)p_Var3)->
                  super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                  )._M_impl._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)pTVar2) {
    std::__cxx11::string::string((string *)&local_70,local_78,&local_81);
    prefixedName(&local_50,this,&local_70);
    bVar1 = anon_unknown_12::ppfound(&local_50,(PP_entry *)(p_Var3 + 1),false);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      *(undefined1 *)&p_Var3[5]._M_next = 1;
    }
    pTVar2 = this->m_table;
  }
LAB_003ea65d:
  return p_Var4 != local_80;
}

Assistant:

bool
ParmParse::contains (const char* name) const
{
    for ( const_list_iterator li = m_table.begin(), End = m_table.end(); li != End; ++li )
    {
       if ( ppfound(prefixedName(name), *li, false))
       {
           //
           // Found an entry; mark all occurrences of name as used.
           //
           for ( const_list_iterator lli = m_table.begin(); lli != m_table.end(); ++lli )
           {
               if ( ppfound(prefixedName(name), *lli, false) )
               {
                   lli->m_queried = true;
               }
           }
           return true;
       }
    }
    return false;
}